

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalStreamingWindow::ExecuteFunctions
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *output,
          DataChunk *delayed,GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  size_type __n;
  ExpressionType EVar1;
  unsigned_long val;
  pointer pLVar2;
  pointer pLVar3;
  _func_int **pp_Var4;
  data_ptr_t pdVar5;
  const_reference pvVar6;
  const_reference this_00;
  type pEVar7;
  reference pvVar8;
  reference this_01;
  type other;
  reference this_02;
  pointer this_03;
  reference this_04;
  pointer this_05;
  long lVar9;
  NotImplementedException *this_06;
  uint uVar10;
  ExpressionType type;
  ExecutionContext *context_00;
  unsigned_long val_00;
  ExecutionContext *__n_00;
  string local_70;
  string local_50;
  
  val = output->count;
  pvVar6 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalOperator).children,0);
  if ((this->select_list).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->select_list).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pLVar2 = (pvVar6->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar3 = (pvVar6->_M_data->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    __n_00 = (ExecutionContext *)0x0;
    do {
      __n = (long)__n_00 + ((long)pLVar2 - (long)pLVar3 >> 3) * -0x5555555555555555;
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](&this->select_list,(size_type)__n_00);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(this_00);
      pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
      EVar1 = (pEVar7->super_BaseExpression).type;
      uVar10 = EVar1 - 0x78;
      if (uVar10 < 0xe) {
        if ((0x40bU >> (uVar10 & 0x1f) & 1) == 0) {
          if ((0x3000U >> (uVar10 & 0x1f) & 1) == 0) {
            if (uVar10 != 5) goto LAB_01649b7d;
            pp_Var4 = gstate_p[1]._vptr_GlobalOperatorState;
            pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
            if (val != 0) {
              pdVar5 = pvVar8->data;
              val_00 = 0;
              do {
                lVar9 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val_00);
                *(long *)(pdVar5 + val_00 * 8) = lVar9 + (long)pp_Var4;
                val_00 = val_00 + 1;
              } while (val != val_00);
            }
          }
          else {
            this_02 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>,_true>
                                    *)(state_p + 9),(size_type)__n_00);
            this_03 = unique_ptr<duckdb::StreamingWindowState::LeadLagState,_std::default_delete<duckdb::StreamingWindowState::LeadLagState>,_true>
                      ::operator->(this_02);
            StreamingWindowState::LeadLagState::Execute(this_03,context,output,delayed,pvVar8);
          }
        }
        else {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&output->data,__n);
          this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                    ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                                  *)(state_p + 2),(size_type)__n_00);
          other = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (this_01);
          Vector::Reference(pvVar8,other);
        }
      }
      else {
LAB_01649b7d:
        if (EVar1 != WINDOW_AGGREGATE) {
          this_06 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"%s for StreamingWindow","");
          ExpressionTypeToString_abi_cxx11_
                    (&local_50,(duckdb *)(ulong)(pEVar7->super_BaseExpression).type,type);
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this_06,&local_70,&local_50);
          __cxa_throw(this_06,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        context_00 = __n_00;
        this_04 = vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>,_true>
                                *)(state_p + 5),(size_type)__n_00);
        this_05 = unique_ptr<duckdb::StreamingWindowState::AggregateState,_std::default_delete<duckdb::StreamingWindowState::AggregateState>,_true>
                  ::operator->(this_04);
        StreamingWindowState::AggregateState::Execute(this_05,context_00,output,pvVar8);
      }
      __n_00 = (ExecutionContext *)((long)&__n_00->client + 1);
    } while (__n_00 < (ExecutionContext *)
                      ((long)(this->select_list).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->select_list).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  lVar9 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
  LOCK();
  gstate_p[1]._vptr_GlobalOperatorState =
       (_func_int **)((long)gstate_p[1]._vptr_GlobalOperatorState + lVar9);
  UNLOCK();
  return;
}

Assistant:

void PhysicalStreamingWindow::ExecuteFunctions(ExecutionContext &context, DataChunk &output, DataChunk &delayed,
                                               GlobalOperatorState &gstate_p, OperatorState &state_p) const {
	auto &gstate = gstate_p.Cast<StreamingWindowGlobalState>();
	auto &state = state_p.Cast<StreamingWindowState>();

	// Compute window functions
	const idx_t count = output.size();
	const column_t input_width = children[0].get().GetTypes().size();
	for (column_t expr_idx = 0; expr_idx < select_list.size(); expr_idx++) {
		column_t col_idx = input_width + expr_idx;
		auto &expr = *select_list[expr_idx];
		auto &result = output.data[col_idx];
		switch (expr.GetExpressionType()) {
		case ExpressionType::WINDOW_AGGREGATE:
			state.aggregate_states[expr_idx]->Execute(context, output, result);
			break;
		case ExpressionType::WINDOW_FIRST_VALUE:
		case ExpressionType::WINDOW_PERCENT_RANK:
		case ExpressionType::WINDOW_RANK:
		case ExpressionType::WINDOW_RANK_DENSE: {
			// Reference constant vector
			output.data[col_idx].Reference(*state.const_vectors[expr_idx]);
			break;
		}
		case ExpressionType::WINDOW_ROW_NUMBER: {
			// Set row numbers
			int64_t start_row = gstate.row_number;
			auto rdata = FlatVector::GetData<int64_t>(output.data[col_idx]);
			for (idx_t i = 0; i < count; i++) {
				rdata[i] = NumericCast<int64_t>(start_row + NumericCast<int64_t>(i));
			}
			break;
		}
		case ExpressionType::WINDOW_LAG:
		case ExpressionType::WINDOW_LEAD:
			state.lead_lag_states[expr_idx]->Execute(context, output, delayed, result);
			break;
		default:
			throw NotImplementedException("%s for StreamingWindow", ExpressionTypeToString(expr.GetExpressionType()));
		}
	}
	gstate.row_number += NumericCast<int64_t>(count);
}